

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  undefined1 local_348 [8];
  MatrixXd result;
  Matrix<double,__1,__1,_0,__1,__1> local_318;
  undefined1 local_300 [8];
  pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> data;
  HJNN hjnn;
  int local_40 [5];
  int local_2c;
  undefined1 local_28 [8];
  vector<LayerInfo,_std::allocator<LayerInfo>_> info;
  
  info.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<LayerInfo,_std::allocator<LayerInfo>_>::vector
            ((vector<LayerInfo,_std::allocator<LayerInfo>_> *)local_28);
  local_2c = 2;
  std::vector<LayerInfo,std::allocator<LayerInfo>>::emplace_back<int,ActivationFunc*&>
            ((vector<LayerInfo,std::allocator<LayerInfo>> *)local_28,&local_2c,&LINEAR);
  local_40[0] = 2;
  std::vector<LayerInfo,std::allocator<LayerInfo>>::emplace_back<int,ActivationFunc*&>
            ((vector<LayerInfo,std::allocator<LayerInfo>> *)local_28,local_40,&SIGMOID);
  hjnn._644_4_ = 1;
  std::vector<LayerInfo,std::allocator<LayerInfo>>::emplace_back<int,ActivationFunc*&>
            ((vector<LayerInfo,std::allocator<LayerInfo>> *)local_28,(int *)&hjnn.field_0x284,
             &LINEAR);
  HJNN::HJNN((HJNN *)&data.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols,(vector<LayerInfo,_std::allocator<LayerInfo>_> *)local_28);
  genrate2ClassNormalData2d
            ((pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_300,-5.0,2.0,1.0,6.0,-2.0,1.0,0x14);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (&local_318,(Matrix<double,__1,__1,_0,__1,__1> *)local_300);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,(Matrix<double,__1,__1,_0,__1,__1> *)
                     &data.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols);
  HJNN::train((HJNN *)&data.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols,&local_318,
              (MatrixXd *)
              &result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols,0.001,100,0.1);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_318);
  HJNN::printNetInfo((HJNN *)&data.second.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols);
  HJNN::predict((MatrixXd *)local_348,
                (HJNN *)&data.second.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols,(MatrixXd *)local_300);
  poVar1 = std::operator<<((ostream *)&std::cout,"original data:\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                    local_300);
  poVar1 = std::operator<<(poVar1,"\ntruth:");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                    &data.first.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_cols);
  poVar1 = std::operator<<(poVar1,"\npredict:");
  Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_348);
  info.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_348);
  std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
  ~pair((pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *
        )local_300);
  HJNN::~HJNN((HJNN *)&data.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols);
  std::vector<LayerInfo,_std::allocator<LayerInfo>_>::~vector
            ((vector<LayerInfo,_std::allocator<LayerInfo>_> *)local_28);
  return info.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
	vector<LayerInfo> info;
	info.emplace_back(2,LINEAR);
	info.emplace_back(2,SIGMOID);
	info.emplace_back(1,LINEAR);
	HJNN hjnn(info);
	auto data=genrate2ClassNormalData2d(-5,2,1,6,-2,1,20);
	hjnn.train(data.first,data.second,0.001,100,0.1);
	hjnn.printNetInfo();
	auto result=hjnn.predict(data.first);
	cout<<"original data:\n"<<data.first<<"\ntruth:"<<data.second<<"\npredict:"<<result;
//	if(hjnn.saveModel("normal.model"))cout<<"\nsave successfully!";
	return 0;
}